

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

triplet<unsigned_short> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
::decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
           *this,triplet<unsigned_short> ra,triplet<unsigned_short> rb)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint uVar6;
  int iVar7;
  triplet<unsigned_short> tVar8;
  reference pvVar9;
  default_traits<unsigned_short,_charls::triplet<unsigned_short>_> *this_00;
  uchar *tbs;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  uchar *puVar10;
  uint uVar11;
  array<charls::context_run_mode,_2UL> *this_01;
  size_t in_R8;
  int32_t error_value3;
  int32_t error_value2;
  int32_t error_value1;
  jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
  *this_local;
  anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3 aStack_18;
  triplet<unsigned_short> rb_local;
  triplet<unsigned_short> ra_local;
  
  rb_local.field_1.v2 = (unsigned_short)ra.field_2;
  this_01 = &this->context_run_mode_;
  pvVar9 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  iVar4 = decode_run_interruption_error(this,pvVar9);
  pvVar9 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  iVar5 = decode_run_interruption_error(this,pvVar9);
  pvVar9 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  uVar6 = decode_run_interruption_error(this,pvVar9);
  tbs = (uchar *)(ulong)uVar6;
  this_00 = &this->traits_;
  uVar11 = rb._0_4_ & 0xffff;
  iVar7 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar11 - (ra._0_4_ & 0xffff)),(uchar *)pvVar9,siglen,
                       tbs,in_R8);
  puVar10 = (uchar *)(ulong)uVar11;
  uVar1 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
          compute_reconstructed_sample(this_00,uVar11,iVar4 * iVar7);
  aStack_18 = rb.field_1;
  uVar11 = (uint)aStack_18.v2;
  rb_local.field_0.v1 = (unsigned_short)ra.field_1;
  iVar7 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar11 - rb_local.field_0.v1),puVar10,siglen_00,tbs,
                       in_R8);
  puVar10 = (uchar *)(ulong)uVar11;
  uVar2 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
          compute_reconstructed_sample(this_00,uVar11,iVar5 * iVar7);
  iVar7 = charls::sign((EVP_PKEY_CTX *)(ulong)((uint)rb.field_2.v3 - (uint)rb_local.field_1.v2),
                       puVar10,siglen_01,tbs,in_R8);
  uVar3 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
          compute_reconstructed_sample(this_00,(uint)rb.field_2.v3,uVar6 * iVar7);
  triplet<unsigned_short>::triplet
            ((triplet<unsigned_short> *)&rb_local.field_2,(uint)uVar1,(uint)uVar2,(uint)uVar3);
  tVar8.field_2.v3 = ra_local.field_1.v2;
  tVar8.field_0.v1 = rb_local.field_2.v3;
  tVar8.field_1.v2 = ra_local.field_0.v1;
  return tVar8;
}

Assistant:

triplet<sample_type> decode_run_interruption_pixel(triplet<sample_type> ra, triplet<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }